

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetRPATH(cmGeneratorTarget *this,string *config,string *prop,string *rpath)

{
  cmLocalGenerator *lg;
  pointer this_00;
  string *psVar1;
  bool bVar2;
  string local_90;
  cmGeneratorExpression local_70;
  cmListFileBacktrace local_58;
  undefined1 local_48 [8];
  cmGeneratorExpression ge;
  char *value;
  string *rpath_local;
  string *prop_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetProperty(this,prop);
  bVar2 = ge.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar2) {
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_58);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_48,&local_58);
    cmListFileBacktrace::~cmListFileBacktrace(&local_58);
    cmGeneratorExpression::Parse(&local_70,local_48);
    this_00 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)&local_70);
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_90);
    psVar1 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_90);
    std::__cxx11::string::operator=((string *)rpath,(string *)psVar1);
    std::__cxx11::string::~string((string *)&local_90);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_70);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_48);
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::GetRPATH(const std::string& config,
                                 const std::string& prop,
                                 std::string& rpath) const
{
  const char* value = this->GetProperty(prop);
  if (!value) {
    return false;
  }

  cmGeneratorExpression ge;
  rpath = ge.Parse(value)->Evaluate(this->LocalGenerator, config);

  return true;
}